

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O1

int __thiscall
wabt::string_view::compare(string_view *this,size_type pos1,size_type n1,char *s,size_type n2)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_type __n;
  
  uVar3 = this->size_ - pos1;
  if (pos1 <= this->size_) {
    if (uVar3 < n1) {
      n1 = uVar3;
    }
    __n = n2;
    if (n1 < n2) {
      __n = n1;
    }
    uVar2 = 0;
    if (__n != 0) {
      uVar2 = memcmp(this->data_ + pos1,s,__n);
    }
    uVar1 = -(uint)(n1 < n2) | 1;
    if (uVar2 != 0) {
      uVar1 = uVar2;
    }
    if (n1 == n2) {
      uVar1 = uVar2;
    }
    return uVar1;
  }
  __assert_fail("pos <= size_",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/string-view.cc"
                ,0x3e,"string_view wabt::string_view::substr(size_type, size_type) const");
}

Assistant:

int string_view::compare(size_type pos1,
                         size_type n1,
                         const char* s,
                         size_type n2) const {
  return substr(pos1, n1).compare(string_view(s, n2));
}